

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

longlong SoapySDRDevice_getHardwareTime(SoapySDRDevice *device,char *what)

{
  char *in_RSI;
  long *in_RDI;
  exception *ex;
  allocator local_39;
  string local_38 [32];
  char *local_18;
  long *local_10;
  longlong local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  SoapySDRDevice_clearError();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,local_18,&local_39);
  local_8 = (**(code **)(*local_10 + 0x270))(local_10,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return local_8;
}

Assistant:

long long SoapySDRDevice_getHardwareTime(const SoapySDRDevice *device, const char *what)
{
    __SOAPY_SDR_C_TRY
    return device->getHardwareTime(what);
    __SOAPY_SDR_C_CATCH
}